

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_skylight.cpp
# Opt level: O0

double __thiscall ON_Skylight::ShadowIntensity(ON_Skylight *this)

{
  ON_InternalXMLImpl *this_00;
  wchar_t *path_to_node;
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  ON_Skylight *local_10;
  ON_Skylight *this_local;
  
  this_00 = &this->m_impl->super_ON_InternalXMLImpl;
  local_10 = this;
  path_to_node = XMLPath();
  ::ON_XMLVariant::ON_XMLVariant(&local_200,1.0);
  ON_InternalXMLImpl::GetParameter
            (&local_108,this_00,path_to_node,L"skylight-shadow-intensity",&local_200);
  dVar1 = ::ON_XMLVariant::AsDouble(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  return dVar1;
}

Assistant:

double ON_Skylight::ShadowIntensity(void) const
{
  // ShadowIntensity is currently unused. See [SHADOW_INTENSITY_UNUSED]
  return m_impl->GetParameter(XMLPath(), ON_RDK_SUN_SKYLIGHT_SHADOW_INTENSITY, 1.0).AsDouble();
}